

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O1

void __thiscall ogg_tools::process(ogg_tools *this,cl_parser *cl)

{
  char *pcVar1;
  int iVar2;
  char *__s;
  bool status;
  string local_40;
  
  local_40._M_dataplus._M_p._0_1_ = 1;
  tools_base::check_path(&this->super_tools_base,"$game_sounds$",(bool *)&local_40);
  tools_base::check_path(&this->super_tools_base,xray_re::PA_SOUNDS,(bool *)&local_40);
  if ((char)local_40._M_dataplus._M_p == '\x01') {
    if (xray_re::xr_file_system::instance()::instance0 == '\0') {
      iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0);
      if (iVar2 != 0) {
        xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
        __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                     &xray_re::xr_file_system::instance::instance0,&__dso_handle);
        __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
      }
    }
    __s = xray_re::xr_file_system::resolve_path
                    (&xray_re::xr_file_system::instance::instance0,"$game_sounds$");
    pcVar1 = (char *)(this->m_sounds)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->m_sounds,0,pcVar1,(ulong)__s);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    process_folder(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ogg_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	xr_file_system& fs = xr_file_system::instance();
	m_sounds = fs.resolve_path(PA_GAME_SOUNDS);

	process_folder();
}